

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000002978b0 = 0x2e2e2e2e2e2e2e;
    uRam00000000002978b7._0_1_ = '.';
    uRam00000000002978b7._1_1_ = '.';
    uRam00000000002978b7._2_1_ = '.';
    uRam00000000002978b7._3_1_ = '.';
    uRam00000000002978b7._4_1_ = '.';
    uRam00000000002978b7._5_1_ = '.';
    uRam00000000002978b7._6_1_ = '.';
    uRam00000000002978b7._7_1_ = '.';
    DAT_002978a0 = '.';
    DAT_002978a0_1._0_1_ = '.';
    DAT_002978a0_1._1_1_ = '.';
    DAT_002978a0_1._2_1_ = '.';
    DAT_002978a0_1._3_1_ = '.';
    DAT_002978a0_1._4_1_ = '.';
    DAT_002978a0_1._5_1_ = '.';
    DAT_002978a0_1._6_1_ = '.';
    uRam00000000002978a8 = 0x2e2e2e2e2e2e2e;
    DAT_002978af = 0x2e;
    DAT_00297890 = '.';
    DAT_00297890_1._0_1_ = '.';
    DAT_00297890_1._1_1_ = '.';
    DAT_00297890_1._2_1_ = '.';
    DAT_00297890_1._3_1_ = '.';
    DAT_00297890_1._4_1_ = '.';
    DAT_00297890_1._5_1_ = '.';
    DAT_00297890_1._6_1_ = '.';
    uRam0000000000297898._0_1_ = '.';
    uRam0000000000297898._1_1_ = '.';
    uRam0000000000297898._2_1_ = '.';
    uRam0000000000297898._3_1_ = '.';
    uRam0000000000297898._4_1_ = '.';
    uRam0000000000297898._5_1_ = '.';
    uRam0000000000297898._6_1_ = '.';
    uRam0000000000297898._7_1_ = '.';
    DAT_00297880 = '.';
    DAT_00297880_1._0_1_ = '.';
    DAT_00297880_1._1_1_ = '.';
    DAT_00297880_1._2_1_ = '.';
    DAT_00297880_1._3_1_ = '.';
    DAT_00297880_1._4_1_ = '.';
    DAT_00297880_1._5_1_ = '.';
    DAT_00297880_1._6_1_ = '.';
    uRam0000000000297888._0_1_ = '.';
    uRam0000000000297888._1_1_ = '.';
    uRam0000000000297888._2_1_ = '.';
    uRam0000000000297888._3_1_ = '.';
    uRam0000000000297888._4_1_ = '.';
    uRam0000000000297888._5_1_ = '.';
    uRam0000000000297888._6_1_ = '.';
    uRam0000000000297888._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000297878._0_1_ = '.';
    uRam0000000000297878._1_1_ = '.';
    uRam0000000000297878._2_1_ = '.';
    uRam0000000000297878._3_1_ = '.';
    uRam0000000000297878._4_1_ = '.';
    uRam0000000000297878._5_1_ = '.';
    uRam0000000000297878._6_1_ = '.';
    uRam0000000000297878._7_1_ = '.';
    DAT_002978bf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}